

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall
QIconModeViewBase::filterStartDrag(QIconModeViewBase *this,DropActions supportedActions)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  QPoint *this_00;
  QWidget *pQVar6;
  QWidget *pQVar7;
  QListViewPrivate *pQVar8;
  QModelIndex *args;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selectedIndexes();
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) goto LAB_00518757;
  bVar2 = QWidget::acceptDrops
                    ((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                     super_QAbstractScrollAreaPrivate.viewport);
  if (bVar2) {
    for (args = local_58.ptr; args != local_58.ptr + local_58.size; args = args + 1) {
      pQVar1 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
      uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,args);
      if (((uVar5 & 4) != 0) && (args->c == ((this->super_QCommonListViewBase).dd)->column)) {
        QList<QModelIndex>::emplaceBack<QModelIndex_const&>(&this->draggedItems,args);
      }
    }
  }
  local_68 = 0;
  uStack_60 = 0xffffffffffffffff;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::renderToPixmap
            ((QAbstractItemViewPrivate *)local_88,
             (QModelIndexList *)(this->super_QCommonListViewBase).dd,(QRect *)&local_58);
  iVar3 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
  iVar4 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
  local_68._4_4_ = local_68._4_4_ + iVar4;
  local_68._0_4_ = (int)local_68 + iVar3;
  this_00 = (QPoint *)operator_new(0x10);
  QDrag::QDrag((QDrag *)this_00,(QObject *)(this->super_QCommonListViewBase).qq);
  pQVar1 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar1 + 0xd0))(pQVar1,&local_58);
  QDrag::setMimeData((QMimeData *)this_00);
  QDrag::setPixmap((QPixmap *)this_00);
  QDrag::setHotSpot(this_00);
  pQVar8 = (this->super_QCommonListViewBase).dd;
  (pQVar8->super_QAbstractItemViewPrivate).dropEventMoved = false;
  iVar3 = QDrag::exec(this_00,supportedActions.super_QFlagsStorageHelper<Qt::DropAction,_4>.
                              super_QFlagsStorage<Qt::DropAction>.i,
                      (pQVar8->super_QAbstractItemViewPrivate).defaultDropAction);
  QList<QModelIndex>::clear(&this->draggedItems);
  pQVar8 = (this->super_QCommonListViewBase).dd;
  if ((iVar3 == 2) && ((pQVar8->super_QAbstractItemViewPrivate).dropEventMoved == false)) {
    if ((pQVar8->super_QAbstractItemViewPrivate).dragDropMode == InternalMove) {
      pQVar6 = (QWidget *)QDrag::target();
      pQVar7 = QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
      pQVar8 = (this->super_QCommonListViewBase).dd;
      if (pQVar6 != pQVar7) goto LAB_00518746;
    }
    QAbstractItemViewPrivate::clearOrRemove(&pQVar8->super_QAbstractItemViewPrivate);
    pQVar8 = (this->super_QCommonListViewBase).dd;
  }
LAB_00518746:
  (pQVar8->super_QAbstractItemViewPrivate).dropEventMoved = false;
  QPixmap::~QPixmap((QPixmap *)local_88);
LAB_00518757:
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterStartDrag(Qt::DropActions supportedActions)
{
    // This function does the same thing as in QAbstractItemView::startDrag(),
    // plus adding viewitems to the draggedItems list.
    // We need these items to draw the drag items
    QModelIndexList indexes = dd->selectionModel->selectedIndexes();
    if (indexes.size() > 0 ) {
        if (viewport()->acceptDrops()) {
            QModelIndexList::ConstIterator it = indexes.constBegin();
            for (; it != indexes.constEnd(); ++it)
                if (dd->model->flags(*it) & Qt::ItemIsDragEnabled
                    && (*it).column() == dd->column)
                    draggedItems.push_back(*it);
        }

        QRect rect;
        QPixmap pixmap = dd->renderToPixmap(indexes, &rect);
        rect.adjust(horizontalOffset(), verticalOffset(), 0, 0);
        QDrag *drag = new QDrag(qq);
        drag->setMimeData(dd->model->mimeData(indexes));
        drag->setPixmap(pixmap);
        drag->setHotSpot(dd->pressedPosition - rect.topLeft());
        dd->dropEventMoved = false;
        Qt::DropAction action = drag->exec(supportedActions, dd->defaultDropAction);
        draggedItems.clear();
        // delete item, unless it has already been moved internally (see filterDropEvent)
        if (action == Qt::MoveAction && !dd->dropEventMoved) {
            if (dd->dragDropMode != QAbstractItemView::InternalMove || drag->target() == qq->viewport())
                dd->clearOrRemove();
        }
        dd->dropEventMoved = false;
    }
    return true;
}